

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpw.cpp
# Opt level: O1

int getPW(char *pin,char *newPIN,CK_ULONG userType)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *prompt;
  char *__format;
  char *prompt_00;
  bool bVar4;
  char password1 [256];
  char password2 [256];
  char local_238 [256];
  char local_138 [264];
  
  if (pin == (char *)0x0) {
    iVar1 = 0;
  }
  else {
    sVar3 = strlen(pin);
    iVar1 = (int)sVar3;
    if (iVar1 - 4U < 0xfc) {
      memcpy(local_238,pin,(ulong)(iVar1 + 1));
    }
  }
  if (iVar1 - 0x100U < 0xffffff04) {
    bVar4 = userType == 0;
    __format = "=== User PIN (%i-%i characters) ===\n";
    if (bVar4) {
      __format = "=== SO PIN (%i-%i characters) ===\n";
    }
    prompt_00 = "Please enter user PIN: ";
    if (bVar4) {
      prompt_00 = "Please enter SO PIN: ";
    }
    prompt = "Please reenter user PIN: ";
    if (bVar4) {
      prompt = "Please reenter SO PIN: ";
    }
    do {
      printf(__format,4,0xff);
      iVar1 = getpin(prompt_00,local_238,0x100);
      if (iVar1 < 0) {
        return 1;
      }
      if (iVar1 - 0x100U < 0xffffff04) {
        getPW();
        iVar1 = 0;
      }
      else {
        iVar1 = getpin(prompt,local_138,0x100);
        if (iVar1 < 0) {
          return 1;
        }
        iVar2 = strcmp(local_238,local_138);
        if (iVar2 != 0) {
          getPW();
          iVar1 = 0;
        }
      }
    } while (iVar1 - 0x100U < 0xffffff04);
  }
  memcpy(newPIN,local_238,(ulong)(iVar1 + 1));
  return 0;
}

Assistant:

int getPW(char* pin, char* newPIN, CK_ULONG userType)
{
	char password1[MAX_PIN_LEN+1];
	char password2[MAX_PIN_LEN+1];
	size_t size = MAX_PIN_LEN+1;
	int length = 0;

	// Check if the user has provided a password
	if (pin)
	{
		length = strlen(pin);
		// Save the PIN if it has the correct length
		if (length >= MIN_PIN_LEN && length <= MAX_PIN_LEN)
			memcpy(password1, pin, length+1);
	}

	while (length < MIN_PIN_LEN || length > MAX_PIN_LEN)
	{
		if (userType == CKU_SO)
		{
			printf("=== SO PIN (%i-%i characters) ===\n",
				MIN_PIN_LEN, MAX_PIN_LEN);
			length = getpin("Please enter SO PIN: ",
					password1, size);
		}
		else
		{
			printf("=== User PIN (%i-%i characters) ===\n",
				MIN_PIN_LEN, MAX_PIN_LEN);
			length = getpin("Please enter user PIN: ",
					password1, size);
		}

		if (length < 0)
			return 1;
		if (length < MIN_PIN_LEN || length > MAX_PIN_LEN)
		{
			fprintf(stderr, "ERROR: The length of the PIN is out of range.\n");
			length = 0;
			continue;
		}

		if (userType == CKU_SO)
		{
			length = getpin("Please reenter SO PIN: ",
					password2, size);
		}
		else
		{
			length = getpin("Please reenter user PIN: ",
					password2, size);
		}

		if (length < 0)
			return 1;
		if (strcmp(password1, password2))
		{
			fprintf(stderr, "ERROR: The entered PINs are not equal.\n");
			length = 0;
			continue;
		}
	}

	memcpy(newPIN, password1, length+1);
	return 0;
}